

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMemoryFile.cpp
# Opt level: O2

ssize_t __thiscall
irr::io::CMemoryReadFile::read(CMemoryReadFile *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  size_t sVar3;
  
  lVar1 = this->Pos + (long)__buf;
  sVar3 = this->Len - lVar1;
  if (lVar1 <= this->Len) {
    sVar3 = 0;
  }
  sVar3 = sVar3 + (long)__buf;
  sVar2 = 0;
  if (0 < (long)sVar3) {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),(void *)(this->Pos + (long)this->Buffer),
           sVar3);
    this->Pos = this->Pos + sVar3;
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

size_t CMemoryReadFile::read(void *buffer, size_t sizeToRead)
{
	long amount = static_cast<long>(sizeToRead);
	if (Pos + amount > Len)
		amount -= Pos + amount - Len;

	if (amount <= 0)
		return 0;

	c8 *p = (c8 *)Buffer;
	memcpy(buffer, p + Pos, amount);

	Pos += amount;

	return static_cast<size_t>(amount);
}